

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTestsNamesOnly(Config *config)

{
  pointer pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  reference s;
  ostream *poVar4;
  TestCase *testCaseInfo;
  iterator __end1;
  iterator __begin1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  size_t matchedTests;
  TestSpec *testSpec;
  Config *config_local;
  
  iVar3 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
  matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  testCases = getAllTestCasesSorted(&config->super_IConfig);
  filterTests((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&__range1,testCases,
              (TestSpec *)CONCAT44(extraout_var,iVar3),&config->super_IConfig);
  __end1 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                     ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&__range1);
  testCaseInfo = (TestCase *)
                 clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                           ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&__range1);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                      (&__end1,(__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                                *)&testCaseInfo);
    pTVar1 = matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    s = __gnu_cxx::
        __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
        ::operator*(&__end1);
    matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&((matchedTestCases.
                            super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage)->super_TestCaseInfo).
                          name._M_dataplus._M_p + 1);
    bVar2 = startsWith((string *)s,'#');
    if (bVar2) {
      poVar4 = cout();
      poVar4 = std::operator<<(poVar4,'\"');
      poVar4 = std::operator<<(poVar4,(string *)s);
      std::operator<<(poVar4,'\"');
    }
    else {
      poVar4 = cout();
      std::operator<<(poVar4,(string *)s);
    }
    iVar3 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0x14])();
    if (1 < iVar3) {
      poVar4 = cout();
      poVar4 = std::operator<<(poVar4,"\t@");
      operator<<(poVar4,&(s->super_TestCaseInfo).lineInfo);
    }
    poVar4 = cout();
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&__end1);
  }
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&__range1);
  return (size_t)pTVar1;
}

Assistant:

std::size_t listTestsNamesOnly( Config const& config ) {
        TestSpec const& testSpec = config.testSpec();
        std::size_t matchedTests = 0;
        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( auto const& testCaseInfo : matchedTestCases ) {
            matchedTests++;
            if( startsWith( testCaseInfo.name, '#' ) )
               Catch::cout() << '"' << testCaseInfo.name << '"';
            else
               Catch::cout() << testCaseInfo.name;
            if ( config.verbosity() >= Verbosity::High )
                Catch::cout() << "\t@" << testCaseInfo.lineInfo;
            Catch::cout() << std::endl;
        }
        return matchedTests;
    }